

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O2

size_t BuildAndStoreLiteralPrefixCode
                 (BrotliOnePassArena *s,uint8_t *input,size_t input_size,uint8_t *depths,
                 uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  uint32_t *histogram;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  histogram = s->histogram;
  switchD_014c69ad::default(histogram,0,0x400);
  uVar2 = 0;
  if (input_size < 0x8000) {
    for (; input_size != uVar2; uVar2 = uVar2 + 1) {
      histogram[input[uVar2]] = histogram[input[uVar2]] + 1;
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      uVar1 = histogram[lVar3];
      uVar5 = 0xb;
      if (uVar1 < 0xb) {
        uVar5 = uVar1;
      }
      histogram[lVar3] = uVar1 + uVar5 * 2;
      input_size = input_size + uVar5 * 2;
    }
  }
  else {
    for (; uVar2 < input_size; uVar2 = uVar2 + 0x1d) {
      histogram[input[uVar2]] = histogram[input[uVar2]] + 1;
    }
    input_size = (input_size + 0x1c) / 0x1d;
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      uVar1 = histogram[lVar3];
      uVar5 = 0xb;
      if (uVar1 < 0xb) {
        uVar5 = uVar1;
      }
      histogram[lVar3] = uVar1 + uVar5 * 2 + 1;
      input_size = input_size + (uVar5 * 2 + 1);
    }
  }
  duckdb_brotli::BrotliBuildAndStoreHuffmanTreeFast
            (s->tree,histogram,input_size,8,depths,bits,storage_ix,storage);
  lVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    if (histogram[lVar3] != 0) {
      lVar4 = lVar4 + (ulong)(histogram[lVar3] * (uint)depths[lVar3]);
    }
  }
  return (ulong)(lVar4 * 0x7d) / input_size;
}

Assistant:

static size_t BuildAndStoreLiteralPrefixCode(BrotliOnePassArena* s,
                                             const uint8_t* input,
                                             const size_t input_size,
                                             uint8_t depths[256],
                                             uint16_t bits[256],
                                             size_t* storage_ix,
                                             uint8_t* storage) {
  uint32_t* BROTLI_RESTRICT const histogram = s->histogram;
  size_t histogram_total;
  size_t i;
  memset(histogram, 0, sizeof(s->histogram));

  if (input_size < (1 << 15)) {
    for (i = 0; i < input_size; ++i) {
      ++histogram[input[i]];
    }
    histogram_total = input_size;
    for (i = 0; i < 256; ++i) {
      /* We weigh the first 11 samples with weight 3 to account for the
         balancing effect of the LZ77 phase on the histogram. */
      const uint32_t adjust = 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  } else {
    static const size_t kSampleRate = 29;
    for (i = 0; i < input_size; i += kSampleRate) {
      ++histogram[input[i]];
    }
    histogram_total = (input_size + kSampleRate - 1) / kSampleRate;
    for (i = 0; i < 256; ++i) {
      /* We add 1 to each population count to avoid 0 bit depths (since this is
         only a sample and we don't know if the symbol appears or not), and we
         weigh the first 11 samples with weight 3 to account for the balancing
         effect of the LZ77 phase on the histogram (more frequent symbols are
         more likely to be in backward references instead as literals). */
      const uint32_t adjust = 1 + 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  }
  BrotliBuildAndStoreHuffmanTreeFast(s->tree, histogram, histogram_total,
                                     /* max_bits = */ 8,
                                     depths, bits, storage_ix, storage);
  {
    size_t literal_ratio = 0;
    for (i = 0; i < 256; ++i) {
      if (histogram[i]) literal_ratio += histogram[i] * depths[i];
    }
    /* Estimated encoding ratio, millibytes per symbol. */
    return (literal_ratio * 125) / histogram_total;
  }
}